

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

void obx::internal::throwLastError(obx_err err,char *contextPrefix)

{
  runtime_error *this;
  char *pcVar1;
  string msg;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  if (contextPrefix != (char *)0x0) {
    pcVar1 = (char *)std::__cxx11::string::append((char *)&local_38);
    std::__cxx11::string::append(pcVar1);
  }
  if (err == 0) {
    std::__cxx11::string::append((char *)&local_38);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    *(undefined ***)this = &PTR__runtime_error_00112ae0;
    __cxa_throw(this,&IllegalStateException::typeinfo,std::runtime_error::~runtime_error);
  }
  appendLastErrorText(err,&local_38);
  throwError(err,&local_38);
}

Assistant:

[[noreturn]] void throwLastError(obx_err err, const char* contextPrefix) {
    std::string msg;
    if (contextPrefix) msg.append(contextPrefix).append(": ");

    if (err == OBX_SUCCESS) {  // Zero, there's no error actually: this is atypical corner case, which should be avoided
        msg += "No error occurred (operation was successful)";
        throw IllegalStateException(msg);
    } else {
        appendLastErrorText(err, msg);
        throwError(err, msg);
    }
}